

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmuuidgen.cpp
# Opt level: O3

void __thiscall CommandOptions::CommandOptions(CommandOptions *this,int argc,char **argv)

{
  byte bVar1;
  char *__s1;
  bool bVar2;
  int iVar3;
  bool *pbVar4;
  ulong uVar5;
  bool bVar6;
  
  this->error_flag = true;
  this->no_newline_flag = false;
  this->c_array_flag = false;
  this->version_flag = false;
  this->help_flag = false;
  this->verbose_flag = false;
  if (1 < argc) {
    uVar5 = 1;
    bVar2 = false;
    bVar6 = false;
    do {
      __s1 = argv[uVar5];
      iVar3 = strcmp(__s1,"-help");
      if (iVar3 == 0) {
LAB_001046ab:
        bVar6 = true;
        pbVar4 = &this->help_flag;
      }
      else {
        if (*__s1 != '-') {
LAB_00104707:
          fprintf(_stderr,"Unrecognized option: %s\n",__s1);
          return;
        }
        bVar1 = __s1[1];
        iVar3 = isalpha((int)(char)bVar1);
        if ((iVar3 == 0) || (__s1[2] != '\0')) goto LAB_00104707;
        if (bVar1 < 0x68) {
          if (bVar1 == 0x56) {
            bVar2 = true;
            pbVar4 = &this->version_flag;
          }
          else {
            pbVar4 = &this->c_array_flag;
            if (bVar1 != 99) goto LAB_00104707;
          }
        }
        else {
          if (bVar1 == 0x68) goto LAB_001046ab;
          pbVar4 = &this->verbose_flag;
          if ((bVar1 != 0x76) && (pbVar4 = &this->no_newline_flag, bVar1 != 0x6e))
          goto LAB_00104707;
        }
      }
      *pbVar4 = true;
      uVar5 = uVar5 + 1;
    } while ((uint)argc != uVar5);
    if (bVar6 || bVar2) {
      return;
    }
  }
  this->error_flag = false;
  return;
}

Assistant:

CommandOptions(int argc, const char** argv) :
    error_flag(true), no_newline_flag(false), c_array_flag(false), version_flag(false),
    help_flag(false), verbose_flag(false)
  {
    for ( int i = 1; i < argc; i++ )
      {

	 if ( (strcmp( argv[i], "-help") == 0) )
	   {
	     help_flag = true;
	     continue;
	   }
     
	if ( argv[i][0] == '-' && isalpha(argv[i][1]) && argv[i][2] == 0 )
	  {
	    switch ( argv[i][1] )
	      {
	      case 'c': c_array_flag = true; break;
	      case 'n': no_newline_flag = true; break;
	      case 'h': help_flag = true; break;
	      case 'v': verbose_flag = true; break;
	      case 'V': version_flag = true; break;

	      default:
		fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
		return;
	      }
	  }
	else
	  {
	    fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
	    return;
	  }
      }

    if ( help_flag || version_flag )
      return;
    
    error_flag = false;
  }